

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::widgets::file::validate(file *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  istream *piVar6;
  reference pvVar7;
  ulong uVar8;
  vector<char,_std::allocator<char>_> *this_00;
  vector<char,_std::allocator<char>_> *pvVar9;
  string *psVar10;
  long *in_RDI;
  uint i_1;
  string magic;
  vector<char,_std::allocator<char>_> buf;
  uint i;
  size_t size_max;
  size_t file_size;
  file *in_stack_fffffffffffffe38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  regex *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  allocator *paVar11;
  byte local_142;
  byte local_133;
  bool local_131;
  uint local_124;
  undefined8 local_120;
  undefined8 local_118;
  allocator local_109;
  string local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  allocator<char> local_d2;
  undefined1 local_d1;
  unsigned_long local_b8;
  uint local_ac;
  unsigned_long local_a8;
  byte local_99;
  string local_98 [55];
  byte local_61;
  string local_60 [39];
  byte local_39;
  string local_38 [32];
  ulong local_18;
  bool local_1;
  
  bVar1 = base_widget::set((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if (bVar1) {
    bVar1 = base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
    if (bVar1) {
      if ((*(int *)((long)in_RDI + 0x34) != -1) || ((int)in_RDI[6] != -1)) {
        std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3feba9);
        local_18 = http::file::size((file *)0x3febb1);
        if ((*(int *)((long)in_RDI + 0x34) != -1) &&
           ((ulong)(long)*(int *)((long)in_RDI + 0x34) < local_18)) {
          base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
          return false;
        }
        if (((int)in_RDI[6] != -1) && (local_18 < (ulong)(long)(int)in_RDI[6])) {
          base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
          return false;
        }
      }
      uVar2 = std::__cxx11::string::empty();
      local_39 = 0;
      local_131 = false;
      if ((uVar2 & 1) == 0) {
        std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3fec8f);
        http::file::mime_abi_cxx11_(in_stack_fffffffffffffe38);
        local_39 = 1;
        local_131 = std::operator!=(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->name_);
      }
      if ((local_39 & 1) != 0) {
        std::__cxx11::string::~string(local_38);
      }
      if (local_131 == false) {
        uVar2 = booster::regex::empty();
        local_61 = 0;
        local_133 = 0;
        if ((uVar2 & 1) == 0) {
          std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3fed5b);
          http::file::mime_abi_cxx11_(in_stack_fffffffffffffe38);
          local_61 = 1;
          bVar1 = booster::regex_match<booster::regex>
                            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          local_133 = bVar1 ^ 0xff;
        }
        if ((local_61 & 1) != 0) {
          std::__cxx11::string::~string(local_60);
        }
        if ((local_133 & 1) == 0) {
          uVar2 = booster::regex::empty();
          local_99 = 0;
          local_142 = 0;
          if ((uVar2 & 1) == 0) {
            std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x3fee75);
            http::file::filename_abi_cxx11_(in_stack_fffffffffffffe38);
            local_99 = 1;
            bVar1 = booster::regex_match<booster::regex>
                              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                               (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
            local_142 = bVar1 ^ 0xff;
          }
          if ((local_99 & 1) != 0) {
            std::__cxx11::string::~string(local_98);
          }
          if ((local_142 & 1) == 0) {
            bVar1 = base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
            if ((bVar1) &&
               (bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty(in_stack_fffffffffffffe50), !bVar1)) {
              local_a8 = 0;
              for (local_ac = 0; uVar8 = (ulong)local_ac,
                  sVar4 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(in_RDI + 7)), uVar8 < sVar4; local_ac = local_ac + 1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(in_RDI + 7),(ulong)local_ac);
                local_b8 = std::__cxx11::string::size();
                puVar5 = std::max<unsigned_long>(&local_b8,&local_a8);
                local_a8 = *puVar5;
              }
              local_d1 = 0;
              std::allocator<char>::allocator();
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe60,
                         (size_type)in_stack_fffffffffffffe58,
                         (value_type_conflict *)in_stack_fffffffffffffe50,
                         (allocator_type *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              std::allocator<char>::~allocator(&local_d2);
              std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3ff089);
              piVar6 = http::file::data((file *)0x3ff091);
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)in_stack_fffffffffffffe40,
                         (streamoff)in_stack_fffffffffffffe38);
              std::istream::seekg(piVar6,local_e8,local_e0);
              std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3ff0db);
              piVar6 = http::file::data((file *)0x3ff0e3);
              pvVar7 = std::vector<char,_std::allocator<char>_>::front
                                 ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe40);
              std::istream::read((char *)piVar6,(long)pvVar7);
              pvVar7 = std::vector<char,_std::allocator<char>_>::front
                                 ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe40);
              std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3ff134);
              http::file::data((file *)0x3ff13c);
              uVar8 = std::istream::gcount();
              paVar11 = &local_109;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_108,pvVar7,uVar8,paVar11);
              std::allocator<char>::~allocator((allocator<char> *)&local_109);
              std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3ff1a5);
              piVar6 = http::file::data((file *)0x3ff1ad);
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)in_stack_fffffffffffffe40,
                         (streamoff)in_stack_fffffffffffffe38);
              std::istream::seekg(piVar6,local_120,local_118);
              base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
              local_124 = 0;
              while( true ) {
                this_00 = (vector<char,_std::allocator<char>_> *)(ulong)local_124;
                pvVar9 = (vector<char,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(in_RDI + 7));
                if (pvVar9 <= this_00) break;
                this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 7);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this_01,(ulong)local_124);
                psVar10 = (string *)std::__cxx11::string::size();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this_01,(ulong)local_124);
                iVar3 = std::__cxx11::string::compare((ulong)local_108,0,psVar10);
                if (iVar3 == 0) {
                  base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true
                                    );
                  break;
                }
                local_124 = local_124 + 1;
              }
              std::__cxx11::string::~string(local_108);
              std::vector<char,_std::allocator<char>_>::~vector(this_00);
            }
            local_1 = base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)))
            ;
          }
          else {
            base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
            local_1 = false;
          }
        }
        else {
          base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
          local_1 = false;
        }
      }
      else {
        base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else if ((*(uint *)(in_RDI + 0x10) >> 1 & 1) == 0) {
    base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true);
    local_1 = true;
  }
  else {
    base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool file::validate()
{
	if(!set()) {
		if(check_non_empty_) {
			valid(false);
			return false;
		}
		else {
			valid(true);
			return true;
		}
	}
	if(!valid())
		return false;
	if(size_max_ != -1 || size_min_!= -1) {
		size_t file_size = file_->size();
		if(size_max_ != -1 && file_size > size_t(size_max_)) {
			valid(false);
			return false;
		}
		if(size_min_ != -1 && file_size < size_t(size_min_)) {
			valid(false);
			return false;
		}
	}
	if(!mime_string_.empty() && file_->mime()!=mime_string_) {
		valid(false);
		return false;
	}
	if(!mime_regex_.empty() && !booster::regex_match(file_->mime(),mime_regex_)){
		valid(false);
		return false;
	}
	if(!filename_regex_.empty() && !booster::regex_match(file_->filename(),filename_regex_)){
		valid(false);
		return false;
	}
	if(valid() && !magics_.empty()) {
		size_t size_max = 0;
		for(unsigned i=0;i<magics_.size();i++)
			size_max=std::max(magics_[i].size(),size_max);
		std::vector<char> buf(size_max+1,0);
		file_->data().seekg(0);
		file_->data().read(&buf.front(),size_max);
		std::string magic(&buf.front(),file_->data().gcount());
		file_->data().seekg(0);
		valid(false);
		for(unsigned i=0;i<magics_.size();i++) {
			if(magic.compare(0,magics_[i].size(),magics_[i])==0) {
				valid(true);
				break;
			}
		}
	}
	return valid();

}